

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int a_00;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  stbi_uc *psVar7;
  ulong uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  stbi_uc *psVar15;
  ulong uVar16;
  byte bVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  byte bVar21;
  int iVar22;
  long lVar23;
  stbi_uc *__dest;
  long lVar24;
  byte bVar25;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  byte *pbVar29;
  int iVar30;
  uint uVar31;
  byte *pbVar32;
  long lVar33;
  bool bVar34;
  int local_dc;
  ulong local_80;
  ulong uVar8;
  
  bVar34 = depth == 0x10;
  uVar2 = x * out_n;
  uVar3 = uVar2 << bVar34;
  a_00 = a->s->img_n;
  lVar33 = (long)a_00;
  local_dc = 0;
  psVar7 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar34,0);
  a->out = psVar7;
  if (psVar7 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "outofmem";
  }
  else {
    iVar4 = stbi__mad3sizes_valid(a_00,x,depth,7);
    if (iVar4 == 0) {
      stbi__g_failure_reason = "too large";
    }
    else {
      uVar12 = a_00 * x;
      uVar5 = uVar12 * depth + 7 >> 3;
      uVar8 = (ulong)uVar5;
      if (raw_len < (uVar5 + 1) * y) {
        stbi__g_failure_reason = "not enough pixels";
      }
      else if (y == 0) {
joined_r0x00109c85:
        local_dc = 1;
        if (depth == 0x10) {
LAB_00109c87:
          if (uVar2 * y == 0) {
LAB_0010a09a:
            local_dc = 1;
          }
          else {
            local_dc = 1;
            psVar7 = a->out;
            lVar33 = 0;
            do {
              puVar1 = (ushort *)(psVar7 + lVar33 * 2);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              lVar33 = lVar33 + 1;
            } while (uVar2 * y != (int)lVar33);
          }
        }
      }
      else {
        uVar20 = 0;
        if (depth < 8) {
          uVar20 = (ulong)(uVar2 - uVar5);
        }
        bVar21 = *raw;
        if (bVar21 < 5) {
          uVar13 = (ulong)uVar3;
          lVar28 = (long)(out_n << bVar34);
          iVar4 = x - 1;
          uVar9 = (ulong)y;
          psVar7 = a->out;
          lVar10 = -lVar28;
          uVar16 = 0;
          lVar14 = 0;
          uVar5 = a_00 << bVar34;
          local_80 = (ulong)x;
          do {
            uVar26 = uVar5;
            if (depth < 8) {
              local_80 = uVar8;
              uVar26 = 1;
            }
            if (lVar14 == 0) {
              bVar21 = ""[bVar21];
            }
            lVar23 = uVar20 - uVar13;
            if (0 < (int)uVar26) {
              uVar27 = 0;
              do {
                switch(bVar21) {
                case 0:
                case 1:
                case 5:
                case 6:
                  bVar17 = raw[uVar27 + 1];
                  goto LAB_00109676;
                case 2:
                case 4:
                  bVar17 = psVar7[uVar27 + lVar23];
                  break;
                case 3:
                  bVar17 = psVar7[uVar27 + lVar23] >> 1;
                  break;
                default:
                  goto switchD_0010965e_default;
                }
                bVar17 = bVar17 + raw[uVar27 + 1];
LAB_00109676:
                psVar7[uVar27 + uVar20] = bVar17;
switchD_0010965e_default:
                uVar27 = uVar27 + 1;
              } while (uVar26 != uVar27);
            }
            if (depth == 8) {
              lVar24 = (long)out_n;
              lVar11 = lVar33;
              if (a_00 != out_n) {
                psVar7[lVar33] = 0xff;
              }
LAB_001096ce:
              raw = raw + lVar11 + 1;
              lVar11 = lVar24;
            }
            else {
              if (depth == 0x10) {
                lVar11 = (long)(int)uVar5;
                lVar24 = lVar28;
                if (a_00 != out_n) {
                  (psVar7 + lVar11)[0] = 0xff;
                  (psVar7 + lVar11)[1] = 0xff;
                }
                goto LAB_001096ce;
              }
              raw = raw + 2;
              lVar11 = uVar20 + 1;
              lVar24 = 1;
            }
            __dest = psVar7 + lVar11;
            psVar15 = psVar7 + lVar24 + lVar23;
            if (depth < 8 || a_00 == out_n) {
              uVar5 = ((int)local_80 + -1) * uVar26;
              switch(bVar21) {
              case 0:
                memcpy(__dest,raw,(long)(int)uVar5);
                break;
              case 1:
                if (0 < (int)uVar5) {
                  uVar16 = 0;
                  do {
                    __dest[uVar16] = __dest[uVar16 - (long)(int)uVar26] + raw[uVar16];
                    uVar16 = uVar16 + 1;
                  } while (uVar5 != uVar16);
                }
                break;
              case 2:
                if (0 < (int)uVar5) {
                  uVar16 = 0;
                  do {
                    __dest[uVar16] = psVar15[uVar16] + raw[uVar16];
                    uVar16 = uVar16 + 1;
                  } while (uVar5 != uVar16);
                }
                break;
              case 3:
                if (0 < (int)uVar5) {
                  uVar16 = 0;
                  do {
                    __dest[uVar16] =
                         (char)((uint)__dest[uVar16 - (long)(int)uVar26] + (uint)psVar15[uVar16] >>
                               1) + raw[uVar16];
                    uVar16 = uVar16 + 1;
                  } while (uVar5 != uVar16);
                }
                break;
              case 4:
                if (0 < (int)uVar5) {
                  uVar16 = 0;
                  do {
                    bVar21 = __dest[uVar16 - (long)(int)uVar26];
                    bVar17 = psVar15[uVar16];
                    bVar25 = psVar7[uVar16 + (lVar24 - (int)uVar26) + (uVar20 - uVar13)];
                    iVar30 = ((uint)bVar17 + (uint)bVar21) - (uint)bVar25;
                    uVar18 = iVar30 - (uint)bVar21;
                    uVar6 = -uVar18;
                    if (0 < (int)uVar18) {
                      uVar6 = uVar18;
                    }
                    uVar19 = iVar30 - (uint)bVar17;
                    uVar18 = -uVar19;
                    if (0 < (int)uVar19) {
                      uVar18 = uVar19;
                    }
                    uVar31 = iVar30 - (uint)bVar25;
                    uVar19 = -uVar31;
                    if (0 < (int)uVar31) {
                      uVar19 = uVar31;
                    }
                    if (uVar18 <= uVar19) {
                      bVar25 = bVar17;
                    }
                    if (uVar19 < uVar6) {
                      bVar21 = bVar25;
                    }
                    if (uVar18 < uVar6) {
                      bVar21 = bVar25;
                    }
                    __dest[uVar16] = bVar21 + raw[uVar16];
                    uVar16 = uVar16 + 1;
                  } while (uVar5 != uVar16);
                }
                break;
              case 5:
                if (0 < (int)uVar5) {
                  uVar16 = 0;
                  do {
                    __dest[uVar16] = (__dest[uVar16 - (long)(int)uVar26] >> 1) + raw[uVar16];
                    uVar16 = uVar16 + 1;
                  } while (uVar5 != uVar16);
                }
                break;
              case 6:
                if (0 < (int)uVar5) {
                  uVar16 = 0;
                  do {
                    __dest[uVar16] = __dest[uVar16 - (long)(int)uVar26] + raw[uVar16];
                    uVar16 = uVar16 + 1;
                  } while (uVar5 != uVar16);
                }
              }
              raw = raw + (int)uVar5;
LAB_00109c05:
              if (lVar14 + 1U == uVar9) {
                if (7 < depth) goto joined_r0x00109c85;
                if (y != 0) {
                  uVar5 = x - 1;
                  lVar33 = uVar2 - uVar8;
                  lVar10 = (ulong)uVar5 + 1;
                  uVar26 = 0;
                  uVar20 = 0;
                  do {
                    bVar21 = 1;
                    if (color == 0) {
                      bVar21 = ""[depth];
                    }
                    psVar7 = a->out;
                    pbVar29 = psVar7 + uVar3 * (int)uVar20;
                    pbVar32 = pbVar29 + (uVar2 - uVar8);
                    uVar13 = (ulong)uVar26;
                    if (depth == 4) {
                      uVar6 = uVar12;
                      if (1 < (int)uVar12) {
                        psVar15 = psVar7 + lVar33;
                        uVar18 = uVar12;
                        do {
                          psVar7[uVar13] = (psVar15[uVar13] >> 4) * bVar21;
                          psVar7[uVar13 + 1] = (psVar15[uVar13] & 0xf) * bVar21;
                          uVar6 = uVar18 - 2;
                          psVar15 = psVar15 + 1;
                          psVar7 = psVar7 + 2;
                          bVar34 = 3 < uVar18;
                          uVar18 = uVar6;
                        } while (bVar34);
                        pbVar32 = psVar15 + uVar13;
                        pbVar29 = psVar7 + uVar13;
                      }
                      if (uVar6 == 1) {
                        *pbVar29 = (*pbVar32 >> 4) * bVar21;
                      }
                    }
                    else if (depth == 2) {
                      uVar6 = uVar12;
                      if (3 < (int)uVar12) {
                        psVar15 = psVar7 + lVar33;
                        uVar18 = uVar12;
                        do {
                          psVar7[uVar13] = (psVar15[uVar13] >> 6) * bVar21;
                          psVar7[uVar13 + 1] = (psVar15[uVar13] >> 4 & 3) * bVar21;
                          psVar7[uVar13 + 2] = (psVar15[uVar13] >> 2 & 3) * bVar21;
                          psVar7[uVar13 + 3] = (psVar15[uVar13] & 3) * bVar21;
                          uVar6 = uVar18 - 4;
                          psVar15 = psVar15 + 1;
                          psVar7 = psVar7 + 4;
                          bVar34 = 7 < uVar18;
                          uVar18 = uVar6;
                        } while (bVar34);
                        pbVar32 = psVar15 + uVar13;
                        pbVar29 = psVar7 + uVar13;
                      }
                      if (((0 < (int)uVar6) && (*pbVar29 = (*pbVar32 >> 6) * bVar21, uVar6 != 1)) &&
                         (pbVar29[1] = (*pbVar32 >> 4 & 3) * bVar21, uVar6 == 3)) {
                        pbVar29[2] = (*pbVar32 >> 2 & 3) * bVar21;
                      }
                    }
                    else if (depth == 1) {
                      uVar6 = uVar12;
                      if (7 < (int)uVar12) {
                        psVar15 = psVar7 + lVar33;
                        uVar18 = uVar12;
                        do {
                          psVar7[uVar13] = (char)psVar15[uVar13] >> 7 & bVar21;
                          psVar7[uVar13 + 1] = (char)(psVar15[uVar13] * '\x02') >> 7 & bVar21;
                          psVar7[uVar13 + 2] = (char)(psVar15[uVar13] << 2) >> 7 & bVar21;
                          psVar7[uVar13 + 3] = (char)(psVar15[uVar13] << 3) >> 7 & bVar21;
                          psVar7[uVar13 + 4] = (char)(psVar15[uVar13] << 4) >> 7 & bVar21;
                          psVar7[uVar13 + 5] = (char)(psVar15[uVar13] << 5) >> 7 & bVar21;
                          psVar7[uVar13 + 6] = (char)(psVar15[uVar13] << 6) >> 7 & bVar21;
                          bVar17 = bVar21;
                          if ((psVar15[uVar13] & 1) == 0) {
                            bVar17 = 0;
                          }
                          psVar7[uVar13 + 7] = bVar17;
                          uVar6 = uVar18 - 8;
                          psVar15 = psVar15 + 1;
                          psVar7 = psVar7 + 8;
                          bVar34 = 0xf < uVar18;
                          uVar18 = uVar6;
                        } while (bVar34);
                        pbVar32 = psVar15 + uVar13;
                        pbVar29 = psVar7 + uVar13;
                      }
                      if (((((0 < (int)uVar6) &&
                            (*pbVar29 = (char)*pbVar32 >> 7 & bVar21, uVar6 != 1)) &&
                           ((pbVar29[1] = (char)(*pbVar32 * '\x02') >> 7 & bVar21, 2 < uVar6 &&
                            ((pbVar29[2] = (char)(*pbVar32 << 2) >> 7 & bVar21, uVar6 != 3 &&
                             (pbVar29[3] = (char)(*pbVar32 << 3) >> 7 & bVar21, 4 < uVar6)))))) &&
                          (pbVar29[4] = (char)(*pbVar32 << 4) >> 7 & bVar21, uVar6 != 5)) &&
                         (pbVar29[5] = (char)(*pbVar32 << 5) >> 7 & bVar21, uVar6 == 7)) {
                        pbVar29[6] = (char)(*pbVar32 << 6) >> 7 & bVar21;
                      }
                    }
                    if (a_00 != out_n) {
                      psVar7 = a->out;
                      if (a_00 == 1) {
                        lVar14 = lVar10;
                        if (-1 < (int)uVar5) {
                          do {
                            psVar7[lVar14 * 2 + (uVar13 - 1)] = 0xff;
                            psVar7[lVar14 * 2 + (uVar13 - 2)] = psVar7[lVar14 + (uVar13 - 1)];
                            lVar28 = lVar14 + -1;
                            bVar34 = 0 < lVar14;
                            lVar14 = lVar28;
                          } while (lVar28 != 0 && bVar34);
                        }
                      }
                      else if (-1 < (int)uVar5) {
                        psVar15 = psVar7 + (ulong)uVar5 * 3 + 2 + uVar13;
                        lVar14 = lVar10;
                        do {
                          psVar7[lVar14 * 4 + (uVar13 - 1)] = 0xff;
                          psVar7[lVar14 * 4 + (uVar13 - 2)] = *psVar15;
                          psVar7[lVar14 * 4 + (uVar13 - 3)] = psVar15[-1];
                          psVar7[lVar14 * 4 + (uVar13 - 4)] = psVar15[-2];
                          psVar15 = psVar15 + -3;
                          lVar28 = lVar14 + -1;
                          bVar34 = 0 < lVar14;
                          lVar14 = lVar28;
                        } while (lVar28 != 0 && bVar34);
                      }
                    }
                    uVar20 = uVar20 + 1;
                    uVar26 = uVar26 + uVar3;
                  } while (uVar20 != uVar9);
                  return 1;
                }
                goto LAB_0010a09a;
              }
            }
            else {
              switch(bVar21) {
              case 0:
                if (iVar4 != 0) {
                  iVar30 = iVar4;
                  do {
                    if (0 < (int)uVar26) {
                      uVar27 = 0;
                      do {
                        __dest[uVar27] = raw[uVar27];
                        uVar27 = uVar27 + 1;
                      } while (uVar26 != uVar27);
                    }
                    __dest[(int)uVar5] = 0xff;
                    raw = raw + (int)uVar5;
                    __dest = __dest + lVar28;
                    iVar30 = iVar30 + -1;
                  } while (iVar30 != 0);
                }
                break;
              case 1:
                if (iVar4 != 0) {
                  lVar23 = (long)__dest + lVar10;
                  iVar30 = iVar4;
                  do {
                    if (0 < (int)uVar26) {
                      uVar27 = 0;
                      do {
                        __dest[uVar27] = *(char *)(lVar23 + uVar27) + raw[uVar27];
                        uVar27 = uVar27 + 1;
                      } while (uVar26 != uVar27);
                    }
                    __dest[(int)uVar5] = 0xff;
                    raw = raw + (int)uVar5;
                    __dest = __dest + lVar28;
                    lVar23 = lVar23 + lVar28;
                    iVar30 = iVar30 + -1;
                  } while (iVar30 != 0);
                }
                break;
              case 2:
                if (iVar4 != 0) {
                  iVar30 = iVar4;
                  do {
                    if (0 < (int)uVar26) {
                      uVar27 = 0;
                      do {
                        __dest[uVar27] = psVar15[uVar27] + raw[uVar27];
                        uVar27 = uVar27 + 1;
                      } while (uVar26 != uVar27);
                    }
                    __dest[(int)uVar5] = 0xff;
                    raw = raw + (int)uVar5;
                    __dest = __dest + lVar28;
                    psVar15 = psVar15 + lVar28;
                    iVar30 = iVar30 + -1;
                  } while (iVar30 != 0);
                }
                break;
              case 3:
                if (iVar4 != 0) {
                  lVar23 = (long)__dest + lVar10;
                  iVar30 = iVar4;
                  do {
                    if (0 < (int)uVar26) {
                      uVar27 = 0;
                      do {
                        __dest[uVar27] =
                             (char)((uint)*(byte *)(lVar23 + uVar27) + (uint)psVar15[uVar27] >> 1) +
                             raw[uVar27];
                        uVar27 = uVar27 + 1;
                      } while (uVar26 != uVar27);
                    }
                    __dest[(int)uVar5] = 0xff;
                    raw = raw + (int)uVar5;
                    __dest = __dest + lVar28;
                    psVar15 = psVar15 + lVar28;
                    lVar23 = lVar23 + lVar28;
                    iVar30 = iVar30 + -1;
                  } while (iVar30 != 0);
                }
                break;
              case 4:
                if (iVar4 != 0) {
                  lVar23 = (long)__dest + lVar10;
                  psVar7 = psVar7 + lVar24 + ((uVar20 - lVar28) - uVar13);
                  iVar30 = iVar4;
                  do {
                    if (0 < (int)uVar26) {
                      uVar27 = 0;
                      do {
                        bVar21 = *(byte *)(lVar23 + uVar27);
                        bVar17 = psVar15[uVar27];
                        bVar25 = psVar7[uVar27];
                        iVar22 = ((uint)bVar17 + (uint)bVar21) - (uint)bVar25;
                        uVar18 = iVar22 - (uint)bVar21;
                        uVar6 = -uVar18;
                        if (0 < (int)uVar18) {
                          uVar6 = uVar18;
                        }
                        uVar19 = iVar22 - (uint)bVar17;
                        uVar18 = -uVar19;
                        if (0 < (int)uVar19) {
                          uVar18 = uVar19;
                        }
                        uVar31 = iVar22 - (uint)bVar25;
                        uVar19 = -uVar31;
                        if (0 < (int)uVar31) {
                          uVar19 = uVar31;
                        }
                        if (uVar18 <= uVar19) {
                          bVar25 = bVar17;
                        }
                        if (uVar19 < uVar6) {
                          bVar21 = bVar25;
                        }
                        if (uVar18 < uVar6) {
                          bVar21 = bVar25;
                        }
                        __dest[uVar27] = bVar21 + raw[uVar27];
                        uVar27 = uVar27 + 1;
                      } while (uVar26 != uVar27);
                    }
                    __dest[(int)uVar5] = 0xff;
                    raw = raw + (int)uVar5;
                    __dest = __dest + lVar28;
                    psVar15 = psVar15 + lVar28;
                    lVar23 = lVar23 + lVar28;
                    psVar7 = psVar7 + lVar28;
                    iVar30 = iVar30 + -1;
                  } while (iVar30 != 0);
                }
                break;
              case 5:
                if (iVar4 != 0) {
                  lVar23 = (long)__dest + lVar10;
                  iVar30 = iVar4;
                  do {
                    if (0 < (int)uVar26) {
                      uVar27 = 0;
                      do {
                        __dest[uVar27] = (*(byte *)(lVar23 + uVar27) >> 1) + raw[uVar27];
                        uVar27 = uVar27 + 1;
                      } while (uVar26 != uVar27);
                    }
                    __dest[(int)uVar5] = 0xff;
                    raw = raw + (int)uVar5;
                    __dest = __dest + lVar28;
                    lVar23 = lVar23 + lVar28;
                    iVar30 = iVar30 + -1;
                  } while (iVar30 != 0);
                }
                break;
              case 6:
                if (iVar4 != 0) {
                  lVar23 = (long)__dest + lVar10;
                  iVar30 = iVar4;
                  do {
                    if (0 < (int)uVar26) {
                      uVar27 = 0;
                      do {
                        __dest[uVar27] = *(char *)(lVar23 + uVar27) + raw[uVar27];
                        uVar27 = uVar27 + 1;
                      } while (uVar26 != uVar27);
                    }
                    __dest[(int)uVar5] = 0xff;
                    raw = raw + (int)uVar5;
                    __dest = __dest + lVar28;
                    lVar23 = lVar23 + lVar28;
                    iVar30 = iVar30 + -1;
                  } while (iVar30 != 0);
                }
              }
              if (depth != 0x10) goto LAB_00109c05;
              if (x != 0) {
                psVar7 = a->out + (long)(int)uVar5 + uVar16 + 1;
                uVar16 = (ulong)x;
                do {
                  *psVar7 = 0xff;
                  psVar7 = psVar7 + lVar28;
                  uVar5 = (int)uVar16 - 1;
                  uVar16 = (ulong)uVar5;
                } while (uVar5 != 0);
                goto LAB_00109c05;
              }
              if (lVar14 + 1U == uVar9) goto LAB_00109c87;
            }
            lVar14 = lVar14 + 1;
            uVar16 = (ulong)(uVar3 * (int)lVar14);
            psVar7 = a->out + uVar16;
            bVar21 = *raw;
            uVar5 = uVar26;
          } while (bVar21 < 5);
        }
        stbi__g_failure_reason = "invalid filter";
      }
    }
  }
  return local_dc;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }